

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void rollback_ncommits(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  size_t sVar3;
  fdb_seqnum_t seqnum;
  uint uVar4;
  char *__format;
  int iVar5;
  fdb_kvs_handle *kv1;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *kv2;
  fdb_kvs_info info;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char keybuf [256];
  fdb_kvs_handle *local_2a0;
  fdb_file_handle *local_298;
  fdb_kvs_handle *local_290;
  fdb_kvs_info local_288;
  timeval local_258;
  fdb_kvs_config local_248;
  fdb_config local_230;
  char local_138 [264];
  
  gettimeofday(&local_258,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  mvcc_test* > errorlog.txt");
  local_230.wal_threshold = 0x400;
  local_230.flags = 1;
  local_230.compaction_threshold = '\0';
  local_230.block_reusing_threshold = 0;
  fdb_open(&local_298,"./mvcc_test1",&local_230);
  fdb_kvs_open(local_298,&local_2a0,"kv1",&local_248);
  fdb_kvs_open(local_298,&local_290,(char *)0x0,&local_248);
  uVar4 = 0;
  do {
    if (uVar4 == 10) {
      seqnum = 1000;
      while( true ) {
        if (seqnum == 0) {
          fdb_kvs_close(local_2a0);
          fdb_close(local_298);
          fdb_shutdown();
          memleak_end();
          __format = "%s PASSED\n";
          if (rollback_ncommits()::__test_pass != '\0') {
            __format = "%s FAILED\n";
          }
          fprintf(_stderr,__format,"rollback n commits");
          return;
        }
        fVar2 = fdb_rollback(&local_2a0,seqnum);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        fdb_get_kvs_info(local_2a0,&local_288);
        if (local_288.doc_count != local_288.last_seqnum) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xbc7);
          rollback_ncommits()::__test_pass = '\x01';
          if (local_288.doc_count != local_288.last_seqnum) {
            __assert_fail("info.doc_count == info.last_seqnum",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0xbc7,"void rollback_ncommits()");
          }
        }
        seqnum = seqnum - 100;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xbc3);
      rollback_ncommits()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xbc3,"void rollback_ncommits()");
    }
    for (iVar5 = 0; iVar5 != 100; iVar5 = iVar5 + 1) {
      sprintf(local_138,"key%02d%03d",(ulong)uVar4);
      pfVar1 = local_2a0;
      sVar3 = strlen(local_138);
      fdb_set_kv(pfVar1,local_138,sVar3,(void *)0x0,0);
      pfVar1 = local_290;
      sVar3 = strlen(local_138);
      fdb_set_kv(pfVar1,local_138,sVar3,(void *)0x0,0);
    }
    fdb_commit(local_298,(byte)uVar4 & 1);
    fdb_get_kvs_info(local_2a0,&local_288);
    if (local_288.doc_count != local_288.last_seqnum) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xbbd);
      rollback_ncommits()::__test_pass = '\x01';
      if (local_288.doc_count != local_288.last_seqnum) {
        __assert_fail("info.doc_count == info.last_seqnum",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xbbd,"void rollback_ncommits()");
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void rollback_ncommits()
{

    TEST_INIT();
    memleak_start();

    int r;
    int i, j, n=100;
    int ncommits=10;
    char keybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *kv1, *kv2;
    fdb_kvs_info info;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_status status;
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 0;

    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    fdb_kvs_open(dbfile, &kv2, NULL, &kvs_config);


    for(j=0;j<ncommits;++j){

        // set n docs per commit
        for(i=0;i<n;++i){
            sprintf(keybuf, "key%02d%03d", j, i);
            fdb_set_kv(kv1, keybuf, strlen(keybuf), NULL, 0);
            fdb_set_kv(kv2, keybuf, strlen(keybuf), NULL, 0);
        }
        // alternate commit pattern
        if((j % 2) == 0){
            fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        } else {
            fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        }

        // doc_count should match seqnum since they are unique
        fdb_get_kvs_info(kv1, &info);
        TEST_CHK(info.doc_count == info.last_seqnum);
    }

    // iteratively rollback 5 commits
     for(j=ncommits;j>0;--j){
        status = fdb_rollback(&kv1, j*n);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // check rollback doc_count
        fdb_get_kvs_info(kv1, &info);
        TEST_CHK(info.doc_count == info.last_seqnum);
    }

    fdb_kvs_close(kv1);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();

    TEST_RESULT("rollback n commits");
}